

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::forwardKinematics
          (btMultiBody *this,btAlignedObjectArray<btQuaternion> *world_to_local,
          btAlignedObjectArray<btVector3> *param_2)

{
  btScalar *pbVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined8 *puVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  btMatrix3x3 *pbVar12;
  btMultibodyLink *pbVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  btQuaternion *pbVar16;
  btVector3 *pbVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  btTransform tr;
  btVector3 posr;
  btQuaternion local_98;
  btMatrix3x3 local_88;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar22 = (long)(this->m_links).m_size;
  pbVar12 = (this->m_matrixBuf).m_data;
  btMatrix3x3::setRotation(&local_88,&this->m_baseQuat);
  *(ulong *)pbVar12->m_el[0].m_floats =
       CONCAT44(local_88.m_el[0].m_floats[1],local_88.m_el[0].m_floats[0]);
  *(ulong *)(pbVar12->m_el[0].m_floats + 2) =
       CONCAT44(local_88.m_el[0].m_floats[3],local_88.m_el[0].m_floats[2]);
  *(ulong *)pbVar12->m_el[1].m_floats =
       CONCAT44(local_88.m_el[1].m_floats[1],local_88.m_el[1].m_floats[0]);
  *(undefined8 *)(pbVar12->m_el[1].m_floats + 2) = local_88.m_el[1].m_floats._8_8_;
  *(undefined8 *)pbVar12->m_el[2].m_floats = local_88.m_el[2].m_floats._0_8_;
  *(undefined8 *)(pbVar12->m_el[2].m_floats + 2) = local_88.m_el[2].m_floats._8_8_;
  if (0 < lVar22) {
    lVar20 = 0x150;
    lVar21 = 0;
    do {
      btMatrix3x3::setRotation
                (&local_88,
                 (btQuaternion *)
                 ((long)(((this->m_links).m_data)->m_inertiaLocal).m_floats + lVar20 + -4));
      puVar2 = (undefined8 *)((long)pbVar12[1].m_el[0].m_floats + lVar21);
      *puVar2 = CONCAT44(local_88.m_el[0].m_floats[1],local_88.m_el[0].m_floats[0]);
      puVar2[1] = CONCAT44(local_88.m_el[0].m_floats[3],local_88.m_el[0].m_floats[2]);
      puVar2 = (undefined8 *)((long)pbVar12[1].m_el[1].m_floats + lVar21);
      *puVar2 = CONCAT44(local_88.m_el[1].m_floats[1],local_88.m_el[1].m_floats[0]);
      puVar2[1] = local_88.m_el[1].m_floats._8_8_;
      pbVar1 = (btScalar *)((long)pbVar12[1].m_el[2].m_floats + lVar21);
      *(undefined8 *)pbVar1 = local_88.m_el[2].m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_88.m_el[2].m_floats._8_8_;
      lVar20 = lVar20 + 600;
      lVar21 = lVar21 + 0x30;
    } while (lVar22 * 0x30 != lVar21);
  }
  iVar11 = (this->m_links).m_size;
  uVar15 = world_to_local->m_size;
  iVar18 = (int)((long)iVar11 + 1);
  if (((int)uVar15 <= iVar11) && (world_to_local->m_capacity <= iVar11)) {
    if (iVar18 == 0) {
      pbVar16 = (btQuaternion *)0x0;
    }
    else {
      pbVar16 = (btQuaternion *)btAlignedAllocInternal(((long)iVar11 + 1) * 0x10,0x10);
      uVar15 = world_to_local->m_size;
    }
    if (0 < (int)uVar15) {
      lVar22 = 0;
      do {
        puVar2 = (undefined8 *)((long)(world_to_local->m_data->super_btQuadWord).m_floats + lVar22);
        uVar7 = puVar2[1];
        puVar4 = (undefined8 *)((long)(pbVar16->super_btQuadWord).m_floats + lVar22);
        *puVar4 = *puVar2;
        puVar4[1] = uVar7;
        lVar22 = lVar22 + 0x10;
      } while ((ulong)uVar15 << 4 != lVar22);
    }
    if ((world_to_local->m_data != (btQuaternion *)0x0) && (world_to_local->m_ownsMemory == true)) {
      btAlignedFreeInternal(world_to_local->m_data);
    }
    world_to_local->m_ownsMemory = true;
    world_to_local->m_data = pbVar16;
    world_to_local->m_capacity = iVar18;
  }
  world_to_local->m_size = iVar18;
  uVar15 = param_2->m_size;
  if (((int)uVar15 <= iVar11) && (param_2->m_capacity <= iVar11)) {
    if (iVar18 == 0) {
      pbVar17 = (btVector3 *)0x0;
    }
    else {
      pbVar17 = (btVector3 *)btAlignedAllocInternal((long)iVar18 << 4,0x10);
      uVar15 = param_2->m_size;
    }
    if (0 < (int)uVar15) {
      lVar22 = 0;
      do {
        puVar2 = (undefined8 *)((long)param_2->m_data->m_floats + lVar22);
        uVar7 = puVar2[1];
        puVar4 = (undefined8 *)((long)pbVar17->m_floats + lVar22);
        *puVar4 = *puVar2;
        puVar4[1] = uVar7;
        lVar22 = lVar22 + 0x10;
      } while ((ulong)uVar15 << 4 != lVar22);
    }
    if ((param_2->m_data != (btVector3 *)0x0) && (param_2->m_ownsMemory == true)) {
      btAlignedFreeInternal(param_2->m_data);
    }
    param_2->m_ownsMemory = true;
    param_2->m_data = pbVar17;
    param_2->m_capacity = iVar18;
  }
  param_2->m_size = iVar18;
  pbVar16 = world_to_local->m_data;
  uVar7 = *(undefined8 *)((this->m_baseQuat).super_btQuadWord.m_floats + 2);
  *(undefined8 *)(pbVar16->super_btQuadWord).m_floats =
       *(undefined8 *)(this->m_baseQuat).super_btQuadWord.m_floats;
  *(undefined8 *)((pbVar16->super_btQuadWord).m_floats + 2) = uVar7;
  pbVar17 = param_2->m_data;
  uVar7 = *(undefined8 *)((this->m_basePos).m_floats + 2);
  *(undefined8 *)pbVar17->m_floats = *(undefined8 *)(this->m_basePos).m_floats;
  *(undefined8 *)(pbVar17->m_floats + 2) = uVar7;
  if (0 < (this->m_links).m_size) {
    lVar22 = 0;
    lVar20 = 0;
    lVar21 = 0;
    do {
      pbVar13 = (this->m_links).m_data;
      lVar19 = (long)*(int *)((long)(pbVar13->m_zeroRotParentToThis).super_btQuadWord.m_floats +
                             lVar20 + -4);
      pbVar16 = world_to_local->m_data;
      fVar5 = *(float *)((long)(pbVar13->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar20
                        );
      uVar7 = *(undefined8 *)pbVar16[lVar19 + 1].super_btQuadWord.m_floats;
      fVar24 = -fVar5;
      uVar8 = *(undefined8 *)(pbVar16[lVar19 + 1].super_btQuadWord.m_floats + 2);
      uVar9 = *(undefined8 *)
               ((long)(pbVar13->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar20);
      uVar10 = *(undefined8 *)
                ((long)(pbVar13->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar20 + 4);
      fVar25 = (float)uVar8;
      fVar29 = (float)((ulong)uVar8 >> 0x20);
      fVar6 = *(float *)((long)(pbVar13->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                        lVar20 + 0xc);
      fVar28 = (float)uVar7;
      fVar23 = (float)((ulong)uVar7 >> 0x20);
      fVar26 = (float)uVar10;
      fVar27 = (float)((ulong)uVar10 >> 0x20);
      pfVar3 = (float *)((long)pbVar16[1].super_btQuadWord.m_floats + lVar22);
      *pfVar3 = fVar23 * -fVar27 + fVar25 * fVar26 + fVar6 * fVar28 + (float)uVar9 * fVar29;
      pfVar3[1] = fVar24 * fVar25 +
                  fVar28 * fVar27 + fVar6 * fVar23 + (float)((ulong)uVar9 >> 0x20) * fVar29;
      pfVar3[2] = (fVar5 * fVar23 + fVar6 * fVar25 + fVar27 * fVar29) - fVar28 * fVar26;
      pfVar3[3] = (-fVar26 * fVar23 + fVar6 * fVar29 + fVar24 * fVar28) - fVar25 * fVar27;
      pbVar17 = param_2->m_data;
      pbVar16 = world_to_local->m_data;
      fVar5 = *(float *)((long)pbVar16[1].super_btQuadWord.m_floats + lVar22);
      fVar6 = *(float *)((long)pbVar16[1].super_btQuadWord.m_floats + lVar22 + 0xc);
      pbVar13 = (this->m_links).m_data;
      uVar7 = *(undefined8 *)((long)pbVar16[1].super_btQuadWord.m_floats + lVar22 + 4);
      fVar28 = *(float *)((long)(pbVar13->m_cachedRVector).m_floats + lVar20 + 8);
      fVar24 = (float)((ulong)uVar7 >> 0x20);
      fVar23 = (float)uVar7;
      uVar7 = *(undefined8 *)((long)(pbVar13->m_cachedRVector).m_floats + lVar20);
      fVar29 = (float)uVar7;
      fVar27 = (float)((ulong)uVar7 >> 0x20);
      fVar26 = fVar29 * fVar5 + fVar27 * fVar23 + fVar24 * fVar28;
      uVar7 = *(undefined8 *)((long)(pbVar13->m_cachedRVector).m_floats + lVar20 + 4);
      fVar25 = fVar5 * fVar28 + (fVar6 * fVar27 - fVar29 * fVar24);
      fVar28 = fVar23 * fVar29 + (fVar28 * fVar6 - (float)uVar7 * fVar5);
      fVar29 = fVar24 * fVar27 + (fVar29 * fVar6 - (float)((ulong)uVar7 >> 0x20) * fVar23);
      auVar14._4_4_ =
           (float)((ulong)*(undefined8 *)pbVar17[lVar19 + 1].m_floats >> 0x20) +
           -fVar24 * fVar29 + fVar5 * fVar28 + fVar26 * fVar23 + fVar25 * fVar6;
      auVar14._0_4_ =
           (float)*(undefined8 *)pbVar17[lVar19 + 1].m_floats +
           -fVar23 * fVar28 + fVar24 * fVar25 + fVar26 * fVar5 + fVar29 * fVar6;
      auVar14._8_4_ =
           fVar25 * -fVar5 + fVar29 * fVar23 + fVar26 * fVar24 + fVar28 * fVar6 +
           pbVar17[lVar19 + 1].m_floats[2];
      auVar14._12_4_ = 0;
      *(undefined1 (*) [16])((long)pbVar17[1].m_floats + lVar22) = auVar14;
      lVar21 = lVar21 + 1;
      iVar11 = (this->m_links).m_size;
      lVar20 = lVar20 + 600;
      lVar22 = lVar22 + 0x10;
    } while (lVar21 < iVar11);
    if (0 < iVar11) {
      lVar22 = 0x238;
      lVar20 = 0;
      lVar21 = 0;
      do {
        lVar21 = lVar21 + 1;
        puVar2 = (undefined8 *)((long)param_2->m_data[1].m_floats + lVar20);
        local_58 = *puVar2;
        uStack_50 = puVar2[1];
        pbVar16 = world_to_local->m_data;
        local_98.super_btQuadWord.m_floats[2] =
             -*(btScalar *)((long)pbVar16[1].super_btQuadWord.m_floats + lVar20 + 8);
        local_98.super_btQuadWord.m_floats[3] =
             *(btScalar *)((long)pbVar16[1].super_btQuadWord.m_floats + lVar20 + 0xc);
        local_98.super_btQuadWord.m_floats._0_8_ =
             *(ulong *)((long)pbVar16[1].super_btQuadWord.m_floats + lVar20) ^ 0x8000000080000000;
        local_88.m_el[0].m_floats[0] = 1.0;
        local_88.m_el[0].m_floats[1] = 0.0;
        local_88.m_el[0].m_floats[2] = 0.0;
        local_88.m_el[0].m_floats[3] = 0.0;
        local_88.m_el[1].m_floats[0] = 0.0;
        local_88.m_el[1].m_floats[1] = 1.0;
        local_88.m_el[1].m_floats[2] = 0.0;
        local_88.m_el[1].m_floats[3] = 0.0;
        local_88.m_el[2].m_floats[0] = 0.0;
        local_88.m_el[2].m_floats[1] = 0.0;
        local_88.m_el[2].m_floats[2] = 1.0;
        local_88.m_el[2].m_floats[3] = 0.0;
        local_48 = local_58;
        uStack_40 = uStack_50;
        btMatrix3x3::setRotation(&local_88,&local_98);
        pbVar13 = (this->m_links).m_data;
        puVar2 = (undefined8 *)((long)(pbVar13->m_inertiaLocal).m_floats + lVar22 + -0x34);
        *puVar2 = CONCAT44(local_88.m_el[0].m_floats[1],local_88.m_el[0].m_floats[0]);
        puVar2[1] = CONCAT44(local_88.m_el[0].m_floats[3],local_88.m_el[0].m_floats[2]);
        puVar2 = (undefined8 *)((long)(pbVar13->m_inertiaLocal).m_floats + lVar22 + -0x24);
        *puVar2 = CONCAT44(local_88.m_el[1].m_floats[1],local_88.m_el[1].m_floats[0]);
        puVar2[1] = local_88.m_el[1].m_floats._8_8_;
        pbVar1 = (btScalar *)((long)(pbVar13->m_inertiaLocal).m_floats + lVar22 + -0x14);
        *(undefined8 *)pbVar1 = local_88.m_el[2].m_floats._0_8_;
        *(undefined8 *)(pbVar1 + 2) = local_88.m_el[2].m_floats._8_8_;
        puVar2 = (undefined8 *)((long)(pbVar13->m_inertiaLocal).m_floats + lVar22 + -4);
        *puVar2 = local_58;
        puVar2[1] = uStack_50;
        lVar22 = lVar22 + 600;
        lVar20 = lVar20 + 0x10;
      } while (lVar21 < (this->m_links).m_size);
    }
  }
  return;
}

Assistant:

void	btMultiBody::forwardKinematics(btAlignedObjectArray<btQuaternion>& world_to_local,btAlignedObjectArray<btVector3>& local_origin)
{
	
	int num_links = getNumLinks();

	// Cached 3x3 rotation matrices from parent frame to this frame.
	btMatrix3x3* rot_from_parent =(btMatrix3x3 *) &m_matrixBuf[0];

	rot_from_parent[0] = btMatrix3x3(m_baseQuat);				//m_baseQuat assumed to be alias!?
	
	for (int i = 0; i < num_links; ++i) 
	{
		rot_from_parent[i+1] = btMatrix3x3(m_links[i].m_cachedRotParentToThis);
	}
		
	int nLinks = getNumLinks();
	///base + num m_links
	world_to_local.resize(nLinks+1);
	local_origin.resize(nLinks+1);

	world_to_local[0] = getWorldToBaseRot();
	local_origin[0] = getBasePos();
	
	for (int k=0;k<getNumLinks();k++)
	{
		const int parent = getParent(k);
		world_to_local[k+1] = getParentToLocalRot(k) * world_to_local[parent+1];
		local_origin[k+1] = local_origin[parent+1] + (quatRotate(world_to_local[k+1].inverse() , getRVector(k)));
	}

	for (int link=0;link<getNumLinks();link++)
	{
		int index = link+1;

		btVector3 posr = local_origin[index];
		btScalar quat[4]={-world_to_local[index].x(),-world_to_local[index].y(),-world_to_local[index].z(),world_to_local[index].w()};
		btTransform tr;
		tr.setIdentity();
		tr.setOrigin(posr);
		tr.setRotation(btQuaternion(quat[0],quat[1],quat[2],quat[3]));
		getLink(link).m_cachedWorldTransform = tr;
			
	}

}